

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

bool __thiscall apngasm_cli::Options::specFile(Options *this,string *out)

{
  size_type sVar1;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"file",&local_39);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&this->field_0x28,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (sVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"file",&local_39);
    operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&this->vm)
    ;
    __str = boost::any_cast<std::__cxx11::string_const&>(operand);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (out,__str);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return sVar1 != 0;
}

Assistant:

bool Options::specFile(std::string &out) const {
  if (!vm.count("file")) {
    return false;
  }
  out = vm["file"].as<std::string>();
  return true;
}